

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int LoadEXRFromMemory(float *out_rgba,uchar *memory,char **err)

{
  char cVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  float fVar12;
  EXRImage exr_image;
  EXRVersion exr_version;
  EXRHeader exr_header;
  
  if (out_rgba == (float *)0x0 || memory == (uchar *)0x0) {
    iVar3 = -3;
    if (err == (char **)0x0) {
      return -3;
    }
    pcVar5 = "Invalid argument.\n";
  }
  else {
    memset(&exr_header,0,0x10890);
    iVar3 = ParseEXRVersionFromMemory(&exr_version,memory);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = ParseEXRHeaderFromMemory(&exr_header,&exr_version,memory,err);
    if (iVar3 != 0) {
      return iVar3;
    }
    exr_image.width = 0;
    exr_image.height = 0;
    exr_image.num_channels = 0;
    exr_image.tiles = (EXRTile *)0x0;
    exr_image.images._0_4_ = 0;
    exr_image.images._4_4_ = 0;
    iVar3 = LoadEXRImageFromMemory(&exr_image,&exr_header,memory,err);
    if (iVar3 != 0) {
      return iVar3;
    }
    uVar10 = 0;
    uVar4 = (ulong)(uint)exr_header.num_channels;
    if (exr_header.num_channels < 1) {
      uVar4 = uVar10;
    }
    pcVar5 = (exr_header.channels)->name + 1;
    uVar7 = 0xffffffffffffffff;
    uVar9 = 0xffffffff;
    uVar8 = 0xffffffff;
    uVar6 = 0xffffffff;
    for (; uVar4 != uVar10; uVar10 = uVar10 + 1) {
      cVar1 = ((EXRChannelInfo *)(pcVar5 + -1))->name[0];
      if (cVar1 == 'R') {
        if (*pcVar5 == '\0') {
          uVar7 = uVar10 & 0xffffffff;
        }
      }
      else if (cVar1 == 'A') {
        if (*pcVar5 == '\0') {
          uVar6 = uVar10 & 0xffffffff;
        }
      }
      else if (cVar1 == 'B') {
        if (*pcVar5 == '\0') {
          uVar8 = uVar10 & 0xffffffff;
        }
      }
      else if ((cVar1 == 'G') && (*pcVar5 == '\0')) {
        uVar9 = uVar10 & 0xffffffff;
      }
      pcVar5 = pcVar5 + 0x110;
    }
    iVar3 = -4;
    if ((int)uVar7 == -1) {
      if (err == (char **)0x0) {
        return -4;
      }
      pcVar5 = "R channel not found\n";
    }
    else if ((int)uVar9 == -1) {
      if (err == (char **)0x0) {
        return -4;
      }
      pcVar5 = "G channel not found\n";
    }
    else {
      if ((int)uVar8 != -1) {
        lVar2 = CONCAT44(exr_image.images._4_4_,exr_image.images._0_4_);
        uVar4 = (ulong)(uint)(exr_image.height * exr_image.width);
        if (exr_image.height * exr_image.width < 1) {
          uVar4 = 0;
        }
        for (lVar11 = 0; uVar4 * 4 != lVar11; lVar11 = lVar11 + 4) {
          out_rgba[lVar11] = *(float *)(*(long *)(lVar2 + (long)(int)uVar7 * 8) + lVar11);
          out_rgba[lVar11 + 1] = *(float *)(*(long *)(lVar2 + (long)(int)uVar9 * 8) + lVar11);
          out_rgba[lVar11 + 2] = *(float *)(*(long *)(lVar2 + (long)(int)uVar8 * 8) + lVar11);
          fVar12 = 1.0;
          if (0 < (int)uVar6) {
            fVar12 = *(float *)(*(long *)(lVar2 + uVar6 * 8) + lVar11);
          }
          out_rgba[lVar11 + 3] = fVar12;
        }
        return 0;
      }
      if (err == (char **)0x0) {
        return -4;
      }
      pcVar5 = "B channel not found\n";
    }
  }
  *err = pcVar5;
  return iVar3;
}

Assistant:

int LoadEXRFromMemory(float *out_rgba, const unsigned char *memory,
                      const char **err) {
  if (out_rgba == NULL || memory == NULL) {
    if (err) {
      (*err) = "Invalid argument.\n";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;

  InitEXRHeader(&exr_header);

  int ret = ParseEXRVersionFromMemory(&exr_version, memory);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  ret = ParseEXRHeaderFromMemory(&exr_header, &exr_version, memory, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  InitEXRImage(&exr_image);
  ret = LoadEXRImageFromMemory(&exr_image, &exr_header, memory, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exr_header.num_channels; c++) {
    if (strcmp(exr_header.channels[c].name, "R") == 0) {
      idxR = c;
    } else if (strcmp(exr_header.channels[c].name, "G") == 0) {
      idxG = c;
    } else if (strcmp(exr_header.channels[c].name, "B") == 0) {
      idxB = c;
    } else if (strcmp(exr_header.channels[c].name, "A") == 0) {
      idxA = c;
    }
  }

  if (idxR == -1) {
    if (err) {
      (*err) = "R channel not found\n";
    }

    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  if (idxG == -1) {
    if (err) {
      (*err) = "G channel not found\n";
    }
    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  if (idxB == -1) {
    if (err) {
      (*err) = "B channel not found\n";
    }
    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  // Assume `out_rgba` have enough memory allocated.
  for (int i = 0; i < exr_image.width * exr_image.height; i++) {
    out_rgba[4 * i + 0] = reinterpret_cast<float **>(exr_image.images)[idxR][i];
    out_rgba[4 * i + 1] = reinterpret_cast<float **>(exr_image.images)[idxG][i];
    out_rgba[4 * i + 2] = reinterpret_cast<float **>(exr_image.images)[idxB][i];
    if (idxA > 0) {
      out_rgba[4 * i + 3] =
          reinterpret_cast<float **>(exr_image.images)[idxA][i];
    } else {
      out_rgba[4 * i + 3] = 1.0;
    }
  }

  return TINYEXR_SUCCESS;
}